

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

QRect __thiscall
QPixmapStyle::scrollBarSubControlRect
          (QPixmapStyle *this,QStyleOptionComplex *option,SubControl sc,QWidget *param_3)

{
  Orientation OVar1;
  uint uVar2;
  QStyleOptionSlider *pQVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  QRect QVar12;
  
  pQVar3 = qstyleoption_cast<QStyleOptionSlider_const*>(&option->super_QStyleOption);
  if (pQVar3 != (QStyleOptionSlider *)0x0) {
    OVar1 = pQVar3->orientation;
    uVar9 = ((&(pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.x2)[OVar1 != Horizontal].
             m_i - (&(pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.x1)
                   [OVar1 != Horizontal].m_i) + 1;
    iVar11 = (pQVar3->maximum - pQVar3->minimum) + pQVar3->pageStep;
    iVar7 = (int)(pQVar3->pageStep * uVar9) / iVar11;
    uVar2 = (int)(pQVar3->sliderValue * uVar9) / iVar11 + iVar7;
    if ((int)uVar9 <= (int)uVar2) {
      uVar2 = uVar9;
    }
    uVar4 = (ulong)uVar2;
    uVar10 = (ulong)(uVar2 - iVar7);
    uVar8._0_4_ = (pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.x1;
    uVar8._4_4_ = (pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.y1;
    uVar6._0_4_ = (pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.x2;
    uVar6._4_4_ = (pQVar3->super_QStyleOptionComplex).super_QStyleOption.rect.y2;
    uVar5 = uVar8 >> 0x20;
    if (OVar1 == Horizontal) {
      if (sc == SC_ScrollBarGroove) goto LAB_00332ba9;
      if (sc == SC_ComboBoxListBoxPopup) {
        uVar6 = uVar6 & 0xffffffff00000000 | uVar10;
        goto LAB_00332ba9;
      }
      uVar8 = uVar4;
      if (sc == SC_ScrollBarSlider) {
        uVar6 = uVar6 & 0xffffffff00000000 | uVar4;
        uVar8 = uVar10;
        goto LAB_00332ba9;
      }
    }
    else {
      if (sc == SC_ScrollBarGroove) goto LAB_00332ba9;
      if (sc == SC_ComboBoxListBoxPopup) {
        uVar6 = uVar6 & 0xffffffff | uVar10 << 0x20;
        goto LAB_00332ba9;
      }
      uVar5 = uVar4;
      if (sc == SC_ScrollBarSlider) {
        uVar6 = uVar6 & 0xffffffff | uVar4 << 0x20;
        uVar5 = uVar10;
        goto LAB_00332ba9;
      }
    }
    if (sc == SC_ComboBoxArrow) goto LAB_00332ba9;
  }
  uVar6 = 0xffffffffffffffff;
  uVar5 = 0;
  uVar8 = 0;
LAB_00332ba9:
  QVar12._0_8_ = uVar8 & 0xffffffff | uVar5 << 0x20;
  QVar12.x2.m_i = (int)uVar6;
  QVar12.y2.m_i = (int)(uVar6 >> 0x20);
  return QVar12;
}

Assistant:

QRect QPixmapStyle::scrollBarSubControlRect(const QStyleOptionComplex *option,
                                            QStyle::SubControl sc, const QWidget *) const
{
#if QT_CONFIG(slider)
    if (const QStyleOptionSlider *slider =
                qstyleoption_cast<const QStyleOptionSlider*>(option)) {
        int length = (slider->orientation == Qt::Horizontal)
                ? slider->rect.width() : slider->rect.height();
        int page = length * slider->pageStep
                / (slider->maximum - slider->minimum + slider->pageStep);
        int pos = length * slider->sliderValue
                / (slider->maximum - slider->minimum + slider->pageStep);
        pos = qMin(pos+page, length) - page;

        QRect rect = slider->rect;

        if (slider->orientation == Qt::Horizontal) {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setLeft(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setRight(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setLeft(pos);
                rect.setRight(pos+page);
                return rect;
            default: ;
            }
        } else {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setTop(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setBottom(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setTop(pos);
                rect.setBottom(pos+page);
                return rect;
            default: ;
            }
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(sc);
#endif // QT_CONFIG(slider)
    return QRect();
}